

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::GetWindowAlwaysWantOwnViewport(ImGuiWindow *window)

{
  bool bVar1;
  
  if (((((GImGui->IO).ConfigViewportsNoAutoMerge == false) &&
       (((window->WindowClass).ViewportFlagsOverrideSet & 0x100) == 0)) ||
      ((GImGui->ConfigFlagsCurrFrame & 0x400) == 0)) ||
     (((window->field_0x43a & 1) != 0 ||
      (bVar1 = true, (window->Flags & 0x13000000U) != 0 || (window->Flags & 0xc000000U) == 0x4000000
      )))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ImGui::GetWindowAlwaysWantOwnViewport(ImGuiWindow* window)
{
    // Tooltips and menus are not automatically forced into their own viewport when the NoMerge flag is set, however the multiplication of viewports makes them more likely to protrude and create their own.
    ImGuiContext& g = *GImGui;
    if (g.IO.ConfigViewportsNoAutoMerge || (window->WindowClass.ViewportFlagsOverrideSet & ImGuiViewportFlags_NoAutoMerge))
        if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
            if (!window->DockIsActive)
                if ((window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_Tooltip)) == 0)
                    if ((window->Flags & ImGuiWindowFlags_Popup) == 0 || (window->Flags & ImGuiWindowFlags_Modal) != 0)
                        return true;
    return false;
}